

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

bool __thiscall
QHttp2ProtocolHandler::sendHEADERS
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,QHttpNetworkRequest *request)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QHttpNetworkRequestPrivate *pQVar4;
  QNonContiguousByteDevice *pQVar5;
  vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkRequest *in_stack_00000018;
  bool mustUploadData;
  QIODevice *in_stack_00000020;
  bool useProxy;
  HttpHeader headers;
  QNetworkProxy *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *pvVar6;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar6 = in_RDI;
  QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2d21dd);
  QNetworkProxy::type(in_stack_ffffffffffffffa0);
  bVar2 = QHttpNetworkRequest::withCredentials((QHttpNetworkRequest *)0x2d2202);
  if (bVar2) {
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2d2216);
    QHttpNetworkConnectionPrivate::createAuthorization
              ((QHttpNetworkConnectionPrivate *)request,in_stack_00000020,in_stack_00000018);
    pQVar4 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                       ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)in_stack_ffffffffffffffa0)
    ;
    pQVar4->needResendWithCredentials = false;
  }
  QHttp2Connection::maxHeaderListSize
            ((QHttp2Connection *)
             in_RDI[2].super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  anon_unknown.dwarf_657c77::build_headers
            ((QHttpNetworkRequest *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
             (quint32)((ulong)pvVar6 >> 0x20),SUB81((ulong)pvVar6 >> 0x18,0));
  bVar2 = std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::empty(in_RDI);
  if (bVar2) {
    bVar3 = false;
  }
  else {
    pQVar5 = QHttpNetworkRequest::uploadByteDevice((QHttpNetworkRequest *)0x2d22c0);
    in_stack_ffffffffffffffb7 = pQVar5 != (QNonContiguousByteDevice *)0x0;
    bVar3 = QHttp2Stream::sendHEADERS
                      ((QHttp2Stream *)this,(HttpHeader *)stream,request._7_1_,request._6_1_);
  }
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::~vector
            ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool QHttp2ProtocolHandler::sendHEADERS(QHttp2Stream *stream, QHttpNetworkRequest &request)
{
    using namespace HPack;

    bool useProxy = false;
#ifndef QT_NO_NETWORKPROXY
    useProxy = m_connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy;
#endif
    if (request.withCredentials()) {
        m_connection->d_func()->createAuthorization(m_socket, request);
        request.d->needResendWithCredentials = false;
    }
    const auto headers = build_headers(request, h2Connection->maxHeaderListSize(), useProxy);
    if (headers.empty()) // nothing fits into maxHeaderListSize
        return false;

    bool mustUploadData = request.uploadByteDevice();
    return stream->sendHEADERS(headers, !mustUploadData);
}